

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O1

void __thiscall PatternBlock::PatternBlock(PatternBlock *this,int4 off,uintm msk,uintm val)

{
  iterator iVar1;
  uint local_20;
  uintm local_1c;
  
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->offset = off;
  iVar1._M_current =
       (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = val;
  local_1c = msk;
  if (iVar1._M_current ==
      (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->maskvec,iVar1,&local_1c);
  }
  else {
    *iVar1._M_current = msk;
    (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->valvec,iVar1,&local_20);
  }
  else {
    *iVar1._M_current = local_20;
    (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  this->nonzerosize = 4;
  normalize(this);
  return;
}

Assistant:

PatternBlock::PatternBlock(int4 off,uintm msk,uintm val)

{				// Define mask and value pattern, confined to one uintm
  offset = off;
  maskvec.push_back(msk);
  valvec.push_back(val);
  nonzerosize = sizeof(uintm);	// Assume all non-zero bytes before normalization
  normalize();
}